

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

void duckdb::ApproxQuantileFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *this;
  AggregateFunctionSet *in_RDI;
  LogicalType aLStack_1ca8 [24];
  AggregateFunction local_1c90;
  AggregateFunction local_1b60;
  AggregateFunction local_1a30;
  AggregateFunction local_1900;
  AggregateFunction local_17d0;
  AggregateFunction local_16a0;
  AggregateFunction local_1570;
  AggregateFunction local_1440;
  AggregateFunction local_1310;
  AggregateFunction local_11e0;
  AggregateFunction local_10b0;
  AggregateFunction local_f80;
  AggregateFunction local_e50;
  AggregateFunction local_d20;
  AggregateFunction local_bf0;
  AggregateFunction local_ac0;
  AggregateFunction local_990;
  AggregateFunction local_860;
  AggregateFunction local_730;
  AggregateFunction local_600;
  AggregateFunction local_4d0;
  AggregateFunction local_3a0;
  AggregateFunction local_270;
  AggregateFunction local_140;
  
  duckdb::AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  GetApproxQuantileDecimal();
  this = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
         (in_RDI + 0x20);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_140);
  AggregateFunction::~AggregateFunction(&local_140);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,SMALLINT);
  GetApproximateQuantileAggregate(&local_270,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_270);
  AggregateFunction::~AggregateFunction(&local_270);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,INTEGER);
  GetApproximateQuantileAggregate(&local_3a0,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_3a0);
  AggregateFunction::~AggregateFunction(&local_3a0);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,BIGINT);
  GetApproximateQuantileAggregate(&local_4d0,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_4d0);
  AggregateFunction::~AggregateFunction(&local_4d0);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,HUGEINT);
  GetApproximateQuantileAggregate(&local_600,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_600);
  AggregateFunction::~AggregateFunction(&local_600);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,DOUBLE);
  GetApproximateQuantileAggregate(&local_730,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_730);
  AggregateFunction::~AggregateFunction(&local_730);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,DATE);
  GetApproximateQuantileAggregate(&local_860,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_860);
  AggregateFunction::~AggregateFunction(&local_860);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,TIME);
  GetApproximateQuantileAggregate(&local_990,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_990);
  AggregateFunction::~AggregateFunction(&local_990);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,TIME_TZ);
  GetApproximateQuantileAggregate(&local_ac0,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_ac0);
  AggregateFunction::~AggregateFunction(&local_ac0);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,TIMESTAMP);
  GetApproximateQuantileAggregate(&local_bf0,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_bf0);
  AggregateFunction::~AggregateFunction(&local_bf0);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,TIMESTAMP_TZ);
  GetApproximateQuantileAggregate(&local_d20,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_d20);
  AggregateFunction::~AggregateFunction(&local_d20);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  GetApproxQuantileDecimalList();
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_e50);
  AggregateFunction::~AggregateFunction(&local_e50);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,TINYINT);
  GetApproxQuantileListAggregate(&local_f80,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_f80);
  AggregateFunction::~AggregateFunction(&local_f80);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,SMALLINT);
  GetApproxQuantileListAggregate(&local_10b0,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_10b0);
  AggregateFunction::~AggregateFunction(&local_10b0);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,INTEGER);
  GetApproxQuantileListAggregate(&local_11e0,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_11e0);
  AggregateFunction::~AggregateFunction(&local_11e0);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,BIGINT);
  GetApproxQuantileListAggregate(&local_1310,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_1310);
  AggregateFunction::~AggregateFunction(&local_1310);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,HUGEINT);
  GetApproxQuantileListAggregate(&local_1440,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_1440);
  AggregateFunction::~AggregateFunction(&local_1440);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,FLOAT);
  GetApproxQuantileListAggregate(&local_1570,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_1570);
  AggregateFunction::~AggregateFunction(&local_1570);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,DOUBLE);
  GetApproxQuantileListAggregate(&local_16a0,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_16a0);
  AggregateFunction::~AggregateFunction(&local_16a0);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,DATE);
  GetApproxQuantileListAggregate(&local_17d0,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_17d0);
  AggregateFunction::~AggregateFunction(&local_17d0);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,TIME);
  GetApproxQuantileListAggregate(&local_1900,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_1900);
  AggregateFunction::~AggregateFunction(&local_1900);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,TIME_TZ);
  GetApproxQuantileListAggregate(&local_1a30,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_1a30);
  AggregateFunction::~AggregateFunction(&local_1a30);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,TIMESTAMP);
  GetApproxQuantileListAggregate(&local_1b60,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_1b60);
  AggregateFunction::~AggregateFunction(&local_1b60);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  duckdb::LogicalType::LogicalType(aLStack_1ca8,TIMESTAMP_TZ);
  GetApproxQuantileListAggregate(&local_1c90,aLStack_1ca8);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_1c90);
  AggregateFunction::~AggregateFunction(&local_1c90);
  duckdb::LogicalType::~LogicalType(aLStack_1ca8);
  return;
}

Assistant:

AggregateFunctionSet ApproxQuantileFun::GetFunctions() {
	AggregateFunctionSet approx_quantile;
	approx_quantile.AddFunction(GetApproxQuantileDecimal());

	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::SMALLINT));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::INTEGER));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::BIGINT));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::HUGEINT));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::DOUBLE));

	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::DATE));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::TIME));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::TIME_TZ));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::TIMESTAMP));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::TIMESTAMP_TZ));

	// List variants
	approx_quantile.AddFunction(GetApproxQuantileDecimalList());

	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::TINYINT));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::SMALLINT));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::INTEGER));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::BIGINT));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::HUGEINT));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::FLOAT));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::DOUBLE));

	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalType::DATE));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalType::TIME));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalType::TIME_TZ));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalType::TIMESTAMP));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalType::TIMESTAMP_TZ));

	return approx_quantile;
}